

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVisualShapeFEA.cpp
# Opt level: O2

void chrono::TriangleNormalsSmooth
               (vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                *normals,vector<int,_std::allocator<int>_> *accumul)

{
  double dVar1;
  pointer pCVar2;
  pointer pCVar3;
  pointer piVar4;
  double dVar5;
  uint uVar6;
  ulong uVar7;
  double dVar8;
  
  pCVar2 = (normals->
           super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar3 = (normals->
           super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
  piVar4 = (accumul->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  for (uVar6 = 0; uVar7 = (ulong)uVar6, uVar7 < (ulong)(((long)pCVar3 - (long)pCVar2) / 0x18);
      uVar6 = uVar6 + 1) {
    dVar8 = 1.0 / (double)piVar4[uVar7];
    dVar1 = pCVar2[uVar7].m_data[2];
    dVar5 = pCVar2[uVar7].m_data[1];
    pCVar2[uVar7].m_data[0] = dVar8 * pCVar2[uVar7].m_data[0];
    pCVar2[uVar7].m_data[1] = dVar8 * dVar5;
    pCVar2[uVar7].m_data[2] = dVar8 * dVar1;
  }
  return;
}

Assistant:

void TriangleNormalsSmooth(std::vector<ChVector<>>& normals, std::vector<int>& accumul) {
    for (unsigned int nn = 0; nn < normals.size(); ++nn) {
        normals[nn] = normals[nn] * (1.0 / (double)accumul[nn]);
    }
}